

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmSourceFile * __thiscall
cmMakefile::CreateSource(cmMakefile *this,string *sourceName,bool generated)

{
  cmSourceFile *this_00;
  allocator local_59;
  string local_58;
  cmSourceFile *local_28;
  cmSourceFile *sf;
  string *psStack_18;
  bool generated_local;
  string *sourceName_local;
  cmMakefile *this_local;
  
  sf._7_1_ = generated;
  psStack_18 = sourceName;
  sourceName_local = (string *)this;
  this_00 = (cmSourceFile *)operator_new(0x128);
  cmSourceFile::cmSourceFile(this_00,this,psStack_18);
  local_28 = this_00;
  if ((sf._7_1_ & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_58,"GENERATED",&local_59);
    cmSourceFile::SetProperty(this_00,&local_58,"1");
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
  }
  std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::push_back
            (&this->SourceFiles,&local_28);
  return local_28;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated)
{
  cmSourceFile* sf = new cmSourceFile(this, sourceName);
  if(generated)
    {
    sf->SetProperty("GENERATED", "1");
    }
  this->SourceFiles.push_back(sf);
  return sf;
}